

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::GenericPackage::GenericPackage(GenericPackage *this,GenericPackage *rhs)

{
  GenericPackage *rhs_local;
  GenericPackage *this_local;
  
  InterchangeObject::InterchangeObject
            (&this->super_InterchangeObject,(rhs->super_InterchangeObject).m_Dict);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__GenericPackage_00339e30;
  UMID::UMID(&this->PackageUID);
  optional_property<ASDCP::MXF::UTF16String>::optional_property(&this->Name);
  Kumu::Timestamp::Timestamp(&this->PackageCreationDate);
  Kumu::Timestamp::Timestamp(&this->PackageModifiedDate);
  Array<Kumu::UUID>::Array(&this->Tracks);
  (*(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket[0x12])(this,rhs);
  return;
}

Assistant:

GenericPackage::GenericPackage(const GenericPackage& rhs) : InterchangeObject(rhs.m_Dict)
{
  Copy(rhs);
}